

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O2

void __thiscall Potassco::SmodelsInput::matchBody(SmodelsInput *this,RuleBuilder *rule)

{
  Atom_t lit;
  uint uVar1;
  uint uVar2;
  Atom_t AVar3;
  bool bVar4;
  
  uVar1 = ProgramReader::matchPos(&this->super_ProgramReader,0xffffffff,"unsigned integer expected")
  ;
  uVar2 = ProgramReader::matchPos(&this->super_ProgramReader,0xffffffff,"unsigned integer expected")
  ;
  RuleBuilder::startBody(rule);
  while (bVar4 = uVar1 != 0, uVar1 = uVar1 - 1, bVar4) {
    AVar3 = ProgramReader::matchAtom(&this->super_ProgramReader,"atom expected");
    bVar4 = uVar2 == 0;
    lit = -AVar3;
    uVar2 = uVar2 - 1;
    if (bVar4) {
      lit = AVar3;
      uVar2 = 0;
    }
    RuleBuilder::addGoal(rule,lit);
  }
  return;
}

Assistant:

void SmodelsInput::matchBody(RuleBuilder& rule) {
	uint32_t len = matchPos();
	uint32_t neg = matchPos();
	for (rule.startBody(); len--;) {
		Lit_t p = lit(matchAtom());
		if (neg) { p *= -1; --neg; }
		rule.addGoal(p);
	}
}